

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcReconv.c
# Opt level: O3

DdNode * Abc_NodeConeDcs(DdManager *dd,DdNode **pbVarsX,DdNode **pbVarsY,Vec_Ptr_t *vLeaves,
                        Vec_Ptr_t *vRoots,Vec_Ptr_t *vVisited)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  DdNode *pDVar4;
  DdNode *pDVar5;
  DdNode *pDVar6;
  int iStart;
  
  Abc_NodeConeCollect((Abc_Obj_t **)vRoots->pArray,vRoots->nSize,vLeaves,vVisited,0);
  if (0 < vLeaves->nSize) {
    lVar3 = 0;
    do {
      *(DdNode **)((long)vLeaves->pArray[lVar3] + 0x40) = pbVarsX[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 < vLeaves->nSize);
  }
  if (0 < vVisited->nSize) {
    lVar3 = 0;
    do {
      plVar1 = (long *)vVisited->pArray[lVar3];
      lVar2 = *(long *)(*(long *)(*plVar1 + 0x20) + 8);
      pDVar4 = Cudd_bddAnd(dd,(DdNode *)
                              ((ulong)(*(uint *)((long)plVar1 + 0x14) >> 10 & 1) ^
                              *(ulong *)(*(long *)(lVar2 + (long)*(int *)plVar1[4] * 8) + 0x40)),
                           (DdNode *)
                           ((ulong)(*(uint *)((long)plVar1 + 0x14) >> 0xb & 1) ^
                           *(ulong *)(*(long *)(lVar2 + (long)((int *)plVar1[4])[1] * 8) + 0x40)));
      Cudd_Ref(pDVar4);
      plVar1[8] = (long)pDVar4;
      lVar3 = lVar3 + 1;
    } while (lVar3 < vVisited->nSize);
  }
  pDVar4 = dd->one;
  Cudd_Ref(pDVar4);
  iStart = vRoots->nSize;
  if (0 < iStart) {
    lVar3 = 0;
    pDVar6 = pDVar4;
    do {
      pDVar5 = Cudd_bddXnor(dd,*(DdNode **)((long)vRoots->pArray[lVar3] + 0x40),pbVarsY[lVar3]);
      Cudd_Ref(pDVar5);
      pDVar4 = Cudd_bddAnd(dd,pDVar6,pDVar5);
      Cudd_Ref(pDVar4);
      Cudd_RecursiveDeref(dd,pDVar6);
      Cudd_RecursiveDeref(dd,pDVar5);
      lVar3 = lVar3 + 1;
      iStart = vRoots->nSize;
      pDVar6 = pDVar4;
    } while (lVar3 < iStart);
  }
  if (0 < vVisited->nSize) {
    lVar3 = 0;
    do {
      Cudd_RecursiveDeref(dd,*(DdNode **)((long)vVisited->pArray[lVar3] + 0x40));
      lVar3 = lVar3 + 1;
    } while (lVar3 < vVisited->nSize);
    iStart = vRoots->nSize;
  }
  pDVar6 = Extra_bddComputeRangeCube(dd,iStart,vLeaves->nSize + iStart);
  Cudd_Ref(pDVar6);
  pDVar5 = Cudd_bddExistAbstract(dd,pDVar4,pDVar6);
  Cudd_Ref(pDVar5);
  Cudd_RecursiveDeref(dd,pDVar6);
  Cudd_RecursiveDeref(dd,pDVar4);
  Cudd_Deref((DdNode *)((ulong)pDVar5 ^ 1));
  return (DdNode *)((ulong)pDVar5 ^ 1);
}

Assistant:

DdNode * Abc_NodeConeDcs( DdManager * dd, DdNode ** pbVarsX, DdNode ** pbVarsY, Vec_Ptr_t * vLeaves, Vec_Ptr_t * vRoots, Vec_Ptr_t * vVisited )
{
    DdNode * bFunc0, * bFunc1, * bFunc, * bTrans, * bTemp, * bCube, * bResult;
    Abc_Obj_t * pNode;
    int i;
    // get the nodes in the cut without fanins in the DFS order
    Abc_NodeConeCollect( (Abc_Obj_t **)vRoots->pArray, vRoots->nSize, vLeaves, vVisited, 0 );
    // set the elementary BDDs
    Vec_PtrForEachEntry( Abc_Obj_t *, vLeaves, pNode, i )
        pNode->pCopy = (Abc_Obj_t *)pbVarsX[i];
    // compute the BDDs for the collected nodes
    Vec_PtrForEachEntry( Abc_Obj_t *, vVisited, pNode, i )
    {
        bFunc0 = Cudd_NotCond( Abc_ObjFanin0(pNode)->pCopy, (int)Abc_ObjFaninC0(pNode) );
        bFunc1 = Cudd_NotCond( Abc_ObjFanin1(pNode)->pCopy, (int)Abc_ObjFaninC1(pNode) );
        bFunc  = Cudd_bddAnd( dd, bFunc0, bFunc1 );    Cudd_Ref( bFunc );
        pNode->pCopy = (Abc_Obj_t *)bFunc;
    }
    // compute the transition relation of the cone
    bTrans = b1;    Cudd_Ref( bTrans );
    Vec_PtrForEachEntry( Abc_Obj_t *, vRoots, pNode, i )
    {
        bFunc = Cudd_bddXnor( dd, (DdNode *)pNode->pCopy, pbVarsY[i] );  Cudd_Ref( bFunc );
        bTrans = Cudd_bddAnd( dd, bTemp = bTrans, bFunc );               Cudd_Ref( bTrans );
        Cudd_RecursiveDeref( dd, bTemp );
        Cudd_RecursiveDeref( dd, bFunc );
    }
    // dereference the intermediate ones
    Vec_PtrForEachEntry( Abc_Obj_t *, vVisited, pNode, i )
        Cudd_RecursiveDeref( dd, (DdNode *)pNode->pCopy );
    // compute don't-cares
    bCube = Extra_bddComputeRangeCube( dd, vRoots->nSize, vRoots->nSize + vLeaves->nSize );  Cudd_Ref( bCube );
    bResult = Cudd_bddExistAbstract( dd, bTrans, bCube );                Cudd_Ref( bResult );
    bResult = Cudd_Not( bResult );
    Cudd_RecursiveDeref( dd, bCube );
    Cudd_RecursiveDeref( dd, bTrans );
    Cudd_Deref( bResult );
    return bResult;
}